

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BiasLayerParams::BiasLayerParams(BiasLayerParams *this,BiasLayerParams *from)

{
  ulong uVar1;
  WeightParams *from_00;
  WeightParams *this_00;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__BiasLayerParams_004b60f8;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->shape_,&from->shape_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  from_00 = from->bias_;
  if (from_00 == (WeightParams *)0x0 ||
      from == (BiasLayerParams *)_BiasLayerParams_default_instance_) {
    this_00 = (WeightParams *)0x0;
  }
  else {
    this_00 = (WeightParams *)operator_new(0x48);
    WeightParams::WeightParams(this_00,from_00);
  }
  this->bias_ = this_00;
  return;
}

Assistant:

BiasLayerParams::BiasLayerParams(const BiasLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      shape_(from.shape_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BiasLayerParams)
}